

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

void __thiscall
Scope::Scope(Scope *this,bool outerScopeCrossesFunctionBarrier,shared_ptr<Scope> *outerScope)

{
  shared_ptr<Scope> *outerScope_local;
  bool outerScopeCrossesFunctionBarrier_local;
  Scope *this_local;
  
  std::shared_ptr<Scope>::shared_ptr(&this->outerScope,outerScope);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>_>_>
  ::unordered_map(&this->localScope);
  this->outerScopeCrossesFunctionBarrier = outerScopeCrossesFunctionBarrier;
  return;
}

Assistant:

explicit Scope(bool outerScopeCrossesFunctionBarrier, std::shared_ptr<Scope> outerScope) noexcept
  : outerScope{outerScope}
  , outerScopeCrossesFunctionBarrier{outerScopeCrossesFunctionBarrier}
  {}